

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::ComputeBuiltinVarCase::~ComputeBuiltinVarCase(ComputeBuiltinVarCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pSVar3;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_021adf70;
  std::
  _Rb_tree<tcu::Vector<unsigned_int,_3>,_std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>,_std::_Select1st<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>,_deqp::gles31::Functional::LexicalCompareVec<unsigned_int,_3>,_std::allocator<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>_>
  ::clear(&(this->m_progMap)._M_t);
  std::
  _Rb_tree<tcu::Vector<unsigned_int,_3>,_std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>,_std::_Select1st<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>,_deqp::gles31::Functional::LexicalCompareVec<unsigned_int,_3>,_std::allocator<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>_>
  ::~_Rb_tree(&(this->m_progMap)._M_t);
  pcVar2 = (this->m_varName)._M_dataplus._M_p;
  paVar1 = &(this->m_varName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pSVar3 = (this->m_subCases).
           super__Vector_base<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar3 != (pointer)0x0) {
    operator_delete(pSVar3,(long)(this->m_subCases).
                                 super__Vector_base<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar3);
  }
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

ComputeBuiltinVarCase::~ComputeBuiltinVarCase (void)
{
	ComputeBuiltinVarCase::deinit();
}